

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

Ivy_Man_t * Ivy_ManStart(void)

{
  Ivy_Man_t *p_00;
  Vec_Ptr_t *pVVar1;
  Ivy_Obj_t *pIVar2;
  int *piVar3;
  Ivy_Man_t *p;
  
  p_00 = (Ivy_Man_t *)malloc(0x110);
  memset(p_00,0,0x110);
  (p_00->Ghost).Id = -1;
  p_00->nTravIds = 1;
  p_00->fCatchExor = 1;
  pVVar1 = Vec_PtrAlloc(100);
  p_00->vPis = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  p_00->vPos = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  p_00->vBufs = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  p_00->vObjs = pVVar1;
  Ivy_ManStartMemory(p_00);
  pIVar2 = Ivy_ManFetchMemory(p_00);
  p_00->pConst1 = pIVar2;
  *(uint *)&p_00->pConst1->field_0x8 = *(uint *)&p_00->pConst1->field_0x8 & 0xffffff7f | 0x80;
  Vec_PtrPush(p_00->vObjs,p_00->pConst1);
  p_00->nCreated = 1;
  p_00->nTableSize = 0x2717;
  piVar3 = (int *)malloc((long)p_00->nTableSize << 2);
  p_00->pTable = piVar3;
  memset(p_00->pTable,0,(long)p_00->nTableSize << 2);
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ivy_Man_t * Ivy_ManStart()
{
    Ivy_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Ivy_Man_t, 1 );
    memset( p, 0, sizeof(Ivy_Man_t) );
    // perform initializations
    p->Ghost.Id   = -1;
    p->nTravIds   =  1;
    p->fCatchExor =  1;
    // allocate arrays for nodes
    p->vPis = Vec_PtrAlloc( 100 );
    p->vPos = Vec_PtrAlloc( 100 );
    p->vBufs = Vec_PtrAlloc( 100 );
    p->vObjs = Vec_PtrAlloc( 100 );
    // prepare the internal memory manager
    Ivy_ManStartMemory( p );
    // create the constant node
    p->pConst1 = Ivy_ManFetchMemory( p );
    p->pConst1->fPhase = 1;
    Vec_PtrPush( p->vObjs, p->pConst1 );
    p->nCreated = 1;
    // start the table
    p->nTableSize = 10007;
    p->pTable = ABC_ALLOC( int, p->nTableSize );
    memset( p->pTable, 0, sizeof(int) * p->nTableSize );
    return p;
}